

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

bool __thiscall SocketInternals::SetMulticastIP(SocketInternals *this,string *multicast)

{
  uint32_t uVar1;
  unsigned_long first_byte;
  unsigned_long s_addr_new;
  string *multicast_local;
  SocketInternals *this_local;
  
  uVar1 = EthUdpPort::IP_ULong(multicast);
  if (((uVar1 & 0xff) < 0xe0) || (0xef < (uVar1 & 0xff))) {
    this_local._7_1_ = false;
  }
  else {
    (this->ServerAddrBroadcast).sin_addr.s_addr = uVar1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SocketInternals::SetMulticastIP(const std::string &multicast)
{
    unsigned long s_addr_new = EthUdpPort::IP_ULong(multicast);
    unsigned long first_byte = s_addr_new & 0x000000ff;
    if ((first_byte >= 224) && (first_byte <= 239)) {
        ServerAddrBroadcast.sin_addr.s_addr = s_addr_new;
        return true;
    }
    return false;
}